

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab5.c
# Opt level: O1

int CheckDecompress(void)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char *__s;
  
  __stream = fopen("out.txt","rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
    __s = "can\'t open out.txt";
  }
  else {
    sVar2 = fread(LabOutput,1,CONCAT44(InputLength._4_4_,(int)InputLength) + 1,__stream);
    fclose(__stream);
    if ((int)sVar2 == (int)InputLength) {
      iVar1 = bcmp(LabOutput,Input,CONCAT44(InputLength._4_4_,(int)InputLength));
      if (iVar1 == 0) {
        iVar1 = 0;
        __s = "PASSED";
        goto LAB_0010249b;
      }
      printf("output is wrong -- ");
    }
    else {
      printf("output is wrong, got %d bytes, expect exactly %d bytes -- ",sVar2 & 0xffffffff);
    }
    iVar1 = 1;
    __s = "FAILED";
  }
LAB_0010249b:
  puts(__s);
  TestN = TestN + 1;
  return iVar1;
}

Assistant:

static int CheckDecompress(void) {
    FILE *const out = fopen("out.txt", "rb");
    if (!out) {
        printf("can't open out.txt\n");
        TestN++;
        return -1;
    }
    const size_t outputLength = fread(LabOutput, 1, InputLength+1, out);
    fclose(out);
    int passed = CheckSame(outputLength, InputLength);
    if (passed && memcmp(LabOutput, Input, InputLength) != 0) {
        passed = 0;
        printf("output is wrong -- ");
    }
    if (passed) {
        printf("PASSED\n");
        TestN++;
        return 0;
    } else {
        printf("FAILED\n");
        TestN++;
        return 1;
    }
}